

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.hpp
# Opt level: O2

type jsoncons::binary::
     native_to_little<long,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
               (long val,
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               d_first)

{
  long lVar1;
  uint8_t item;
  uint8_t buf [8];
  value_type_conflict local_21;
  long local_20;
  
  local_20 = val;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    local_21 = *(value_type_conflict *)((long)&local_20 + lVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (d_first.container,&local_21);
  }
  return;
}

Assistant:

typename std::enable_if<Endian::native == Endian::little,void>::type
    native_to_little(T val, OutputIt d_first)
    {
        uint8_t buf[sizeof(T)];
        std::memcpy(buf, &val, sizeof(T));
        for (auto item : buf)
        {
            *d_first++ = item;
        }
    }